

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaTests.cc
# Opt level: O2

void avro::schema::testBasic_fail(char *schema)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_wrap_stringstream<char> *pbVar2;
  shared_count *this;
  assertion_result local_288;
  const_string local_270;
  char local_260 [8];
  shared_count local_258 [7];
  const_string local_220;
  const_string local_210;
  const_string local_200;
  const_string local_1f0;
  const_string local_1e0;
  const_string local_1d0;
  undefined1 local_1c0 [16];
  undefined8 *local_1b0;
  char *local_1a8;
  
  local_270.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/SchemaTests.cc"
  ;
  local_270.m_end = "";
  memset((basic_wrap_stringstream<char> *)local_1c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)local_1c0);
  std::operator<<((ostream *)local_1c0,schema);
  pbVar2 = (basic_wrap_stringstream<char> *)local_1c0;
  pbVar1 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  local_1d0.m_begin = (pbVar1->_M_dataplus)._M_p;
  local_1d0.m_end = local_1d0.m_begin + pbVar1->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pbVar2,&local_270,0x93,&local_1d0);
  pbVar2 = (basic_wrap_stringstream<char> *)local_1c0;
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(pbVar2);
  local_1e0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/SchemaTests.cc"
  ;
  local_1e0.m_end = "";
  local_1f0.m_begin = "";
  local_1f0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pbVar2,&local_1e0,0x94,&local_1f0);
  avro::compileJsonSchemaFromString(local_260);
  this = local_258;
  boost::detail::shared_count::~shared_count(this);
  local_200.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/SchemaTests.cc"
  ;
  local_200.m_end = "";
  local_210.m_begin = "";
  local_210.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_200,0x94,&local_210);
  local_288.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_288.m_message.px = (element_type *)0x0;
  local_288.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0[8] = false;
  local_1c0._0_8_ = &PTR__lazy_ostream_001c3308;
  local_1b0 = &boost::unit_test::lazy_ostream::inst;
  local_1a8 = "exception Exception expected but not raised";
  local_220.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/SchemaTests.cc"
  ;
  local_220.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_288,(lazy_ostream *)local_1c0,&local_220,0x94,CHECK,CHECK_MSG,0);
  boost::detail::shared_count::~shared_count(&local_288.m_message.pn);
  return;
}

Assistant:

static void testBasic_fail(const char* schema)
{
    BOOST_TEST_CHECKPOINT(schema);
    BOOST_CHECK_THROW(compileJsonSchemaFromString(schema), Exception);
}